

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaB_loadstring(lua_State *L)

{
  int iVar1;
  char *def;
  char *name;
  size_t l;
  
  def = luaL_checklstring(L,1,&l);
  name = luaL_optlstring(L,2,def,(size_t *)0x0);
  iVar1 = luaL_loadbuffer(L,def,l,name);
  iVar1 = load_aux(L,iVar1);
  return iVar1;
}

Assistant:

static int luaB_loadstring (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  const char *chunkname = luaL_optstring(L, 2, s);
  return load_aux(L, luaL_loadbuffer(L, s, l, chunkname));
}